

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

void __thiscall amrex::MFIter::Initialize(MFIter *this)

{
  IndexType IVar1;
  Vector<int,_std::allocator<int>_> *pVVar2;
  Long LVar3;
  TileArray *pTVar4;
  long in_RDI;
  FabArrayBase *unaff_retaddr;
  int nlft;
  int nr;
  int ntot;
  int nworkers;
  int rit;
  TileArray *pta;
  char *in_stack_000001c8;
  int in_stack_000001d4;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  BoxArray *in_stack_ffffffffffffffa8;
  char *in_stack_fffffffffffffff8;
  
  depth = depth + 1;
  if ((depth != 1) && (allow_multiple_mfiters == 0)) {
    in_stack_fffffffffffffff8 = "depth == 1 || MFIter::allow_multiple_mfiters";
    Assert_host(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4,in_stack_000001c8);
  }
  if ((*(byte *)(in_RDI + 0x1c) & 2) == 0) {
    pTVar4 = FabArrayBase::getTileArray(unaff_retaddr,(IntVect *)in_stack_fffffffffffffff8);
    *(Vector<int,_std::allocator<int>_> **)(in_RDI + 0x38) = &pTVar4->indexMap;
    *(Vector<int,_std::allocator<int>_> **)(in_RDI + 0x40) = &pTVar4->localIndexMap;
    *(Vector<amrex::Box,_std::allocator<amrex::Box>_> **)(in_RDI + 0x48) = &pTVar4->tileArray;
    *(Vector<int,_std::allocator<int>_> **)(in_RDI + 0x50) = &pTVar4->localTileIndexMap;
    *(Vector<int,_std::allocator<int>_> **)(in_RDI + 0x58) = &pTVar4->numLocalTiles;
    LVar3 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x12cdb15);
    *(undefined4 *)(in_RDI + 0x24) = 0;
    *(int *)(in_RDI + 0x28) = (int)LVar3;
    *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x24);
    FabArrayBase::boxArray(*(FabArrayBase **)(in_RDI + 8));
    IVar1 = BoxArray::ixType(in_stack_ffffffffffffffa8);
    *(uint *)(in_RDI + 0x30) = IVar1.itype;
  }
  else {
    pVVar2 = FabArrayBase::IndexArray(*(FabArrayBase **)(in_RDI + 8));
    *(Vector<int,_std::allocator<int>_> **)(in_RDI + 0x38) = pVVar2;
    *(undefined4 *)(in_RDI + 0x20) = 0;
    *(undefined4 *)(in_RDI + 0x24) = 0;
    LVar3 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x12cda8c);
    *(int *)(in_RDI + 0x28) = (int)LVar3;
  }
  return;
}

Assistant:

void
MFIter::Initialize ()
{
#ifdef AMREX_USE_OMP
#pragma omp master
#endif
    {
        ++depth;
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(depth == 1 || MFIter::allow_multiple_mfiters,
            "Nested or multiple active MFIters is not supported by default.  This can be changed by calling MFIter::allowMultipleMFIters(true)".);
    }

#ifdef AMREX_USE_GPU
    if (device_sync) {
#ifdef AMREX_USE_OMP
#pragma omp single
#endif
        Gpu::streamSynchronize();
    }
#endif

    if (flags & AllBoxes)  // a very special case
    {
        index_map    = &(fabArray.IndexArray());
        currentIndex = 0;
        beginIndex   = 0;
        endIndex     = index_map->size();
    }
    else
    {
        const FabArrayBase::TileArray* pta = fabArray.getTileArray(tile_size);

        index_map            = &(pta->indexMap);
        local_index_map      = &(pta->localIndexMap);
        tile_array           = &(pta->tileArray);
        local_tile_index_map = &(pta->localTileIndexMap);
        num_local_tiles      = &(pta->numLocalTiles);

        {
            int rit = 0;
            int nworkers = 1;
#ifdef BL_USE_TEAM
            if (ParallelDescriptor::TeamSize() > 1) {
                if ( tile_size == IntVect::TheZeroVector() ) {
                    // In this case the TileArray contains only boxes owned by this worker.
                    // So there is no sharing going on.
                    rit = 0;
                    nworkers = 1;
                } else {
                    rit = ParallelDescriptor::MyRankInTeam();
                    nworkers = ParallelDescriptor::TeamSize();
                }
            }
#endif

            int ntot = index_map->size();

            if (nworkers == 1)
            {
                beginIndex = 0;
                endIndex = ntot;
            }
            else
            {
                int nr   = ntot / nworkers;
                int nlft = ntot - nr * nworkers;
                if (rit < nlft) {  // get nr+1 items
                    beginIndex = rit * (nr + 1);
                    endIndex = beginIndex + nr + 1;
                } else {           // get nr items
                    beginIndex = rit * nr + nlft;
                    endIndex = beginIndex + nr;
                }
            }
        }

#ifdef AMREX_USE_OMP
        int nthreads = omp_get_num_threads();
        if (nthreads > 1)
        {
            if (dynamic)
            {
                beginIndex = omp_get_thread_num();
            }
            else
            {
                int tid = omp_get_thread_num();
                int ntot = endIndex - beginIndex;
                int nr   = ntot / nthreads;
                int nlft = ntot - nr * nthreads;
                if (tid < nlft) {  // get nr+1 items
                    beginIndex += tid * (nr + 1);
                    endIndex = beginIndex + nr + 1;
                } else {           // get nr items
                    beginIndex += tid * nr + nlft;
                    endIndex = beginIndex + nr;
                }
            }
        }
#endif

        currentIndex = beginIndex;

#ifdef AMREX_USE_GPU
        Gpu::Device::setStreamIndex((streams > 0) ? currentIndex%streams : -1);
#endif

        typ = fabArray.boxArray().ixType();
    }
}